

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_debug.c
# Opt level: O3

uint64_t debug_get_flags_option(char *name,debug_named_value *flags,uint64_t dfault)

{
  char cVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char *pcVar8;
  char cVar9;
  char *pcVar10;
  debug_named_value *pdVar11;
  ulong __n;
  char *__s1;
  char *__s1_00;
  uint uVar12;
  char *pcVar13;
  ulong local_48;
  
  pcVar5 = os_get_option(name);
  local_48 = dfault;
  if (pcVar5 != (char *)0x0) {
    iVar4 = strcmp(pcVar5,"help");
    if (iVar4 == 0) {
      uVar12 = 0;
      _debug_printf("%s: help for %s:\n","debug_get_flags_option",name);
      pcVar5 = flags->name;
      if (pcVar5 != (char *)0x0) {
        pdVar11 = flags + 1;
        pcVar8 = pcVar5;
        do {
          sVar6 = strlen(pcVar8);
          uVar3 = (uint)sVar6;
          if (sVar6 < uVar12) {
            uVar3 = uVar12;
          }
          uVar12 = uVar3;
          pcVar8 = pdVar11->name;
          pdVar11 = pdVar11 + 1;
        } while (pcVar8 != (char *)0x0);
        if (pcVar5 != (char *)0x0) {
          pdVar11 = flags + 1;
          do {
            pcVar8 = pdVar11[-1].desc;
            pcVar10 = " ";
            if (pcVar8 == (char *)0x0) {
              pcVar10 = "";
              pcVar8 = "";
            }
            _debug_printf("| %*s [0x%0*lx]%s%s\n",(ulong)uVar12,pcVar5,0x10,pdVar11[-1].value,
                          pcVar10,pcVar8);
            pcVar5 = pdVar11->name;
            pdVar11 = pdVar11 + 1;
          } while (pcVar5 != (char *)0x0);
        }
      }
    }
    else {
      pcVar8 = flags->name;
      if (pcVar8 == (char *)0x0) {
        local_48 = 0;
      }
      else {
        cVar1 = *pcVar5;
        local_48 = 0;
        do {
          if (cVar1 != '\0') {
            iVar4 = strcmp(pcVar5,"all");
            if (iVar4 != 0) {
              sVar6 = strlen(pcVar8);
              __n = sVar6 & 0xffffffff;
              ppuVar7 = __ctype_b_loc();
              puVar2 = *ppuVar7;
              pcVar13 = pcVar5 + -__n;
              __s1 = pcVar5;
              cVar9 = cVar1;
              pcVar10 = pcVar5;
              do {
                pcVar10 = pcVar10 + 1;
                __s1_00 = __s1;
                if ((((cVar9 != '_') && ((puVar2[cVar9] & 8) == 0)) &&
                    (__s1_00 = pcVar10, __s1 == pcVar13)) &&
                   (iVar4 = bcmp(__s1,pcVar8,__n), iVar4 == 0)) goto LAB_001f8025;
                cVar9 = *pcVar10;
                pcVar13 = pcVar13 + 1;
                __s1 = __s1_00;
              } while (cVar9 != '\0');
              if ((__s1_00 != pcVar13) || (iVar4 = bcmp(__s1_00,pcVar8,__n), iVar4 != 0))
              goto LAB_001f8038;
            }
LAB_001f8025:
            local_48 = local_48 | flags->value;
          }
LAB_001f8038:
          pcVar8 = flags[1].name;
          flags = flags + 1;
        } while (pcVar8 != (char *)0x0);
      }
    }
  }
  if (debug_get_option_should_print_first == '\0') {
    debug_get_option_should_print_first = '\x01';
    debug_get_bool_option("GALLIUM_PRINT_OPTIONS",false);
  }
  return local_48;
}

Assistant:

uint64_t
debug_get_flags_option(const char *name,
                       const struct debug_named_value *flags,
                       uint64_t dfault)
{
   uint64_t result;
   const char *str;
   const struct debug_named_value *orig = flags;
   unsigned namealign = 0;

   str = os_get_option(name);
   if (!str)
      result = dfault;
   else if (!strcmp(str, "help")) {
      result = dfault;
      _debug_printf("%s: help for %s:\n", __FUNCTION__, name);
      for (; flags->name; ++flags)
         namealign = MAX2(namealign, strlen(flags->name));
      for (flags = orig; flags->name; ++flags)
         _debug_printf("| %*s [0x%0*"PRIx64"]%s%s\n", namealign, flags->name,
                      (int)sizeof(uint64_t)*CHAR_BIT/4, flags->value,
                      flags->desc ? " " : "", flags->desc ? flags->desc : "");
   }
   else {
      result = 0;
      while (flags->name) {
	 if (str_has_option(str, flags->name))
	    result |= flags->value;
	 ++flags;
      }
   }

   if (debug_get_option_should_print()) {
      if (str) {
         debug_printf("%s: %s = 0x%"PRIx64" (%s)\n",
                      __FUNCTION__, name, result, str);
      } else {
         debug_printf("%s: %s = 0x%"PRIx64"\n", __FUNCTION__, name, result);
      }
   }

   return result;
}